

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::build_function_control_flow_graphs_and_analyze(Compiler *this)

{
  TypedID<(diligent_spirv_cross::Types)6> *pTVar1;
  int iVar2;
  uint id;
  ulong uVar3;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar4;
  size_t sVar5;
  uint *puVar6;
  bool bVar7;
  __uniq_ptr_impl<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>
  *this_00;
  CFG *this_01;
  SPIRFunction *pSVar8;
  __node_base *p_Var9;
  SPIRBlock *pSVar10;
  Bitset *this_02;
  SPIRVariable *pSVar11;
  Bitset *other;
  SPIRType *pSVar12;
  SPIRConstant *pSVar13;
  long lVar14;
  TypedID<(diligent_spirv_cross::Types)6> *pTVar15;
  CFGBuilder handler;
  AnalyzeVariableScopeAccessHandler scope_handler;
  CFGBuilder local_220;
  AnalyzeVariableScopeAccessHandler local_1d8;
  
  local_220.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__CFGBuilder_00899710;
  local_220.function_cfgs._M_h._M_buckets = &local_220.function_cfgs._M_h._M_single_bucket;
  local_220.function_cfgs._M_h._M_bucket_count = 1;
  local_220.function_cfgs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_220.function_cfgs._M_h._M_element_count = 0;
  local_220.function_cfgs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_220.function_cfgs._M_h._M_rehash_policy._M_next_resize = 0;
  local_220.function_cfgs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1d8.super_OpcodeHandler._vptr_OpcodeHandler._0_4_ = (this->ir).default_entry_point.id;
  local_220.compiler = this;
  this_00 = (__uniq_ptr_impl<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>
             *)::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_220.function_cfgs,(key_type *)&local_1d8);
  this_01 = (CFG *)::operator_new(0x168);
  pSVar8 = get<diligent_spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  CFG::CFG(this_01,this,pSVar8);
  ::std::__uniq_ptr_impl<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>
  ::reset(this_00,this_01);
  pSVar8 = get<diligent_spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar8,&local_220.super_OpcodeHandler);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(this->function_cfgs)._M_h,&local_220.function_cfgs._M_h);
  uVar3 = (this->function_cfgs)._M_h._M_element_count;
  p_Var9 = &(this->function_cfgs)._M_h._M_before_begin;
  do {
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) {
      if (1 < uVar3) {
        puVar6 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
        sVar5 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
        for (lVar14 = 0; sVar5 << 2 != lVar14; lVar14 = lVar14 + 4) {
          pSVar11 = get<diligent_spirv_cross::SPIRVariable>
                              (this,*(uint32_t *)((long)puVar6 + lVar14));
          pSVar12 = get_variable_data_type(this,pSVar11);
          if (((*(uint *)&(pSVar12->super_IVariant).field_0xc & 0xfffffffe) == 0x1c) &&
             (pSVar11->storage == Private)) {
            id = (pSVar11->initializer).id;
            if (((ulong)id != 0) &&
               ((pSVar11->is_written_to == false &&
                ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr[id].type ==
                 TypeConstant)))) {
              pSVar13 = get<diligent_spirv_cross::SPIRConstant>(this,id);
              pSVar13->is_used_as_lut = true;
              (pSVar11->static_expression).id = (pSVar11->initializer).id;
              pSVar11->statically_assigned = true;
              pSVar11->remapped_variable = true;
            }
          }
        }
      }
      CFGBuilder::~CFGBuilder(&local_220);
      return;
    }
    pSVar8 = get<diligent_spirv_cross::SPIRFunction>(this,(uint32_t)*(size_type *)(p_Var9 + 1));
    AnalyzeVariableScopeAccessHandler::AnalyzeVariableScopeAccessHandler(&local_1d8,this,pSVar8);
    analyze_variable_scope(this,pSVar8,&local_1d8);
    find_function_local_luts(this,pSVar8,&local_1d8,uVar3 < 2);
    pTVar15 = (pSVar8->blocks).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.ptr;
    pTVar1 = pTVar15 + (pSVar8->blocks).
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>
                       .buffer_size;
    for (; pTVar15 != pTVar1; pTVar15 = pTVar15 + 1) {
      pSVar10 = get<diligent_spirv_cross::SPIRBlock>(this,pTVar15->id);
      if (1 < (pSVar10->loop_variables).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
              buffer_size) {
        this_02 = ParsedIR::get_decoration_bitset
                            (&this->ir,
                             (ID)((pSVar10->loop_variables).
                                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                 .ptr)->id);
        pSVar11 = get<diligent_spirv_cross::SPIRVariable>
                            (this,((pSVar10->loop_variables).
                                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                  .ptr)->id);
        iVar2 = *(int *)&(pSVar11->super_IVariant).field_0xc;
        pTVar4 = (pSVar10->loop_variables).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                 ptr;
        sVar5 = (pSVar10->loop_variables).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                buffer_size;
        lVar14 = 0;
        do {
          if (sVar5 << 2 == lVar14) goto LAB_002cb66f;
          other = ParsedIR::get_decoration_bitset
                            (&this->ir,(ID)*(uint32_t *)((long)&pTVar4->id + lVar14));
          bVar7 = Bitset::operator!=(this_02,other);
          if (bVar7) break;
          pSVar11 = get<diligent_spirv_cross::SPIRVariable>
                              (this,((pSVar10->loop_variables).
                                     super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                    .ptr)->id);
          lVar14 = lVar14 + 4;
        } while (iVar2 == *(int *)&(pSVar11->super_IVariant).field_0xc);
        pTVar4 = (pSVar10->loop_variables).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                 ptr;
        sVar5 = (pSVar10->loop_variables).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                buffer_size;
        for (lVar14 = 0; sVar5 << 2 != lVar14; lVar14 = lVar14 + 4) {
          pSVar11 = get<diligent_spirv_cross::SPIRVariable>
                              (this,*(uint32_t *)((long)&pTVar4->id + lVar14));
          pSVar11->loop_variable = false;
        }
        (pSVar10->loop_variables).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.buffer_size
             = 0;
      }
LAB_002cb66f:
    }
    AnalyzeVariableScopeAccessHandler::~AnalyzeVariableScopeAccessHandler(&local_1d8);
  } while( true );
}

Assistant:

void Compiler::build_function_control_flow_graphs_and_analyze()
{
	CFGBuilder handler(*this);
	handler.function_cfgs[ir.default_entry_point].reset(new CFG(*this, get<SPIRFunction>(ir.default_entry_point)));
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	function_cfgs = std::move(handler.function_cfgs);
	bool single_function = function_cfgs.size() <= 1;

	for (auto &f : function_cfgs)
	{
		auto &func = get<SPIRFunction>(f.first);
		AnalyzeVariableScopeAccessHandler scope_handler(*this, func);
		analyze_variable_scope(func, scope_handler);
		find_function_local_luts(func, scope_handler, single_function);

		// Check if we can actually use the loop variables we found in analyze_variable_scope.
		// To use multiple initializers, we need the same type and qualifiers.
		for (auto block : func.blocks)
		{
			auto &b = get<SPIRBlock>(block);
			if (b.loop_variables.size() < 2)
				continue;

			auto &flags = get_decoration_bitset(b.loop_variables.front());
			uint32_t type = get<SPIRVariable>(b.loop_variables.front()).basetype;
			bool invalid_initializers = false;
			for (auto loop_variable : b.loop_variables)
			{
				if (flags != get_decoration_bitset(loop_variable) ||
				    type != get<SPIRVariable>(b.loop_variables.front()).basetype)
				{
					invalid_initializers = true;
					break;
				}
			}

			if (invalid_initializers)
			{
				for (auto loop_variable : b.loop_variables)
					get<SPIRVariable>(loop_variable).loop_variable = false;
				b.loop_variables.clear();
			}
		}
	}

	// Find LUTs which are not function local. Only consider this case if the CFG is multi-function,
	// otherwise we treat Private as Function trivially.
	// Needs to be analyzed from the outside since we have to block the LUT optimization if at least
	// one function writes to it.
	if (!single_function)
	{
		for (auto &id : global_variables)
		{
			auto &var = get<SPIRVariable>(id);
			auto &type = get_variable_data_type(var);

			if (is_array(type) && var.storage == StorageClassPrivate &&
			    var.initializer && !var.is_written_to &&
			    ir.ids[var.initializer].get_type() == TypeConstant)
			{
				get<SPIRConstant>(var.initializer).is_used_as_lut = true;
				var.static_expression = var.initializer;
				var.statically_assigned = true;
				var.remapped_variable = true;
			}
		}
	}
}